

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O3

void __thiscall
hayai::ConsoleOutputter::BeginOrSkipTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,size_t *runsCount,size_t *iterationsCount,bool skip)

{
  size_t *psVar1;
  ostream *poVar2;
  char *pcVar3;
  TextColor local_3c;
  size_t *local_38;
  
  local_38 = iterationsCount;
  if (skip) {
    local_3c = TextCyan;
    poVar2 = operator<<(this->_stream,&local_3c);
    pcVar3 = "[ DISABLED ]";
  }
  else {
    local_3c = TextGreen;
    poVar2 = operator<<(this->_stream,&local_3c);
    pcVar3 = "[ RUN      ]";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,0xc);
  local_3c = TextYellow;
  poVar2 = operator<<(this->_stream,&local_3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  Outputter::WriteTestNameToStream(this->_stream,fixtureName,testName,parameters);
  local_3c = TextDefault;
  poVar2 = operator<<(this->_stream,&local_3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  pcVar3 = " runs, ";
  if (*runsCount == 1) {
    pcVar3 = " run, ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,(ulong)(*runsCount == 1) ^ 7);
  psVar1 = local_38;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  pcVar3 = " iterations per run)";
  if (*psVar1 == 1) {
    pcVar3 = " iteration per run)";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,(ulong)(*psVar1 != 1) + 0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

inline void BeginOrSkipTest(const std::string& fixtureName,
                                    const std::string& testName,
                                    const TestParametersDescriptor& parameters,
                                    const std::size_t& runsCount,
                                    const std::size_t& iterationsCount,
                                    const bool skip)
        {
            if (skip)
                _stream << Console::TextCyan << "[ DISABLED ]";
            else
                _stream << Console::TextGreen << "[ RUN      ]";

            _stream << Console::TextYellow << " ";
            WriteTestNameToStream(_stream, fixtureName, testName, parameters);
            _stream << Console::TextDefault
                    << " (" << runsCount
                    << (runsCount == 1 ? " run, " : " runs, ")
                    << iterationsCount
                    << (iterationsCount == 1 ?
                        " iteration per run)" :
                        " iterations per run)")
                    << std::endl;
        }